

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_create_prefix(netaddr *prefix,netaddr *host,netaddr *netmask,_Bool truncate)

{
  byte bVar1;
  undefined8 uVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  
  bVar3 = host->_type;
  iVar5 = -1;
  if ((bVar3 != 0) && (bVar3 == netmask->_type)) {
    bVar3 = netaddr_get_af_maxprefix((uint)bVar3);
    prefix->_prefix_len = '\0';
    prefix->_type = host->_type;
    if (!truncate) {
      uVar2 = *(undefined8 *)(host->_addr + 8);
      *(undefined8 *)prefix->_addr = *(undefined8 *)host->_addr;
      *(undefined8 *)(prefix->_addr + 8) = uVar2;
    }
    uVar4 = 0;
    while (uVar4 < bVar3 >> 3) {
      if (truncate) {
        prefix->_addr[uVar4] = netmask->_addr[uVar4] & host->_addr[uVar4];
      }
      bVar1 = netmask->_addr[uVar4];
      switch(bVar1) {
      case 0xf8:
        prefix->_prefix_len = prefix->_prefix_len + '\x05';
        goto LAB_00104ce3;
      case 0xf9:
      case 0xfa:
      case 0xfb:
      case 0xfd:
        goto switchD_00104c84_caseD_f9;
      case 0xfc:
        prefix->_prefix_len = prefix->_prefix_len + '\x06';
        goto LAB_00104ce3;
      case 0xfe:
        prefix->_prefix_len = prefix->_prefix_len + '\a';
        goto LAB_00104ce3;
      case 0xff:
        prefix->_prefix_len = prefix->_prefix_len + '\b';
        uVar4 = uVar4 + 2;
        break;
      default:
        if (bVar1 == 0) {
          return (uint)bVar1;
        }
        if (bVar1 == 0x80) {
          prefix->_prefix_len = prefix->_prefix_len + '\x01';
        }
        else if (bVar1 == 0xc0) {
          prefix->_prefix_len = prefix->_prefix_len + '\x02';
        }
        else if (bVar1 == 0xe0) {
          prefix->_prefix_len = prefix->_prefix_len + '\x03';
        }
        else {
          if (bVar1 != 0xf0) {
            return -1;
          }
          prefix->_prefix_len = prefix->_prefix_len + '\x04';
        }
        goto LAB_00104ce3;
      }
    }
LAB_00104ce3:
    iVar5 = 0;
  }
switchD_00104c84_caseD_f9:
  return iVar5;
}

Assistant:

int
netaddr_create_prefix(
  struct netaddr *prefix, const struct netaddr *host, const struct netaddr *netmask, bool truncate) {
  int len, maxlen;
  if (host->_type != netmask->_type || host->_type == AF_UNSPEC) {
    return -1;
  }

  /* get address length */
  maxlen = netaddr_get_af_maxprefix(host->_type) / 8;

  /* initialize prefix */
  prefix->_prefix_len = 0;
  prefix->_type = host->_type;

  if (!truncate) {
    memcpy(&prefix->_addr[0], &host->_addr[0], 16);
  }

  for (len = 0; len < maxlen; len++) {
    if (truncate) {
      prefix->_addr[len] = host->_addr[len] & netmask->_addr[len];
    }

    switch (netmask->_addr[len]) {
      case 255:
        len++;
        prefix->_prefix_len += 8;
        break;
      case 254:
        prefix->_prefix_len += 7;
        return 0;
      case 252:
        prefix->_prefix_len += 6;
        return 0;
      case 248:
        prefix->_prefix_len += 5;
        return 0;
      case 240:
        prefix->_prefix_len += 4;
        return 0;
      case 224:
        prefix->_prefix_len += 3;
        return 0;
      case 192:
        prefix->_prefix_len += 2;
        return 0;
      case 128:
        prefix->_prefix_len += 1;
        return 0;
      case 0:
        return 0;
      default:
        return -1;
    }
  }
  return 0;
}